

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_true,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Pluecker<4,_true>_>_>
::occluded(BVHNIntersector1<4,_16777232,_true,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Pluecker<4,_true>_>_>
           *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 *puVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  undefined1 (*pauVar21) [12];
  undefined8 *puVar22;
  float *pfVar23;
  float *pfVar24;
  Collider CVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  AABBNodeMB4D *node1;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  uint uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  int iVar62;
  ulong uVar63;
  byte *pbVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  int iVar73;
  int iVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar102;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar103;
  float fVar105;
  undefined1 auVar104 [16];
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar107 [16];
  float fVar112;
  float fVar113;
  float fVar115;
  float fVar116;
  undefined1 auVar114 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar124;
  float fVar126;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar127;
  undefined1 auVar123 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar148;
  undefined1 auVar142 [16];
  float fVar146;
  undefined1 auVar143 [16];
  float fVar149;
  float fVar152;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  float fStack_cf0;
  float fStack_cec;
  int local_cdc;
  undefined8 local_cd8;
  float fStack_cd0;
  float fStack_ccc;
  undefined8 local_cc8;
  float fStack_cc0;
  float fStack_cbc;
  Intersectors *local_cb0;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  undefined4 uStack_c98;
  undefined4 uStack_c94;
  Ray *local_c90;
  long local_c88;
  long local_c80;
  undefined8 local_c78;
  float fStack_c70;
  float fStack_c6c;
  undefined1 local_c68 [8];
  float fStack_c60;
  float fStack_c5c;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  undefined8 local_c48;
  float fStack_c40;
  float fStack_c3c;
  undefined8 local_c38;
  float fStack_c30;
  float fStack_c2c;
  undefined1 local_c28 [8];
  float fStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  float local_be8;
  undefined4 local_be4;
  uint local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  int *local_bc8;
  undefined8 local_bc0;
  undefined4 *local_bb8;
  Intersectors *local_bb0;
  undefined4 *local_ba8;
  undefined4 local_ba0;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  RayQueryContext *local_b38;
  ulong local_b30;
  ulong *local_b28;
  RayQueryContext *local_b20;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  undefined1 local_a78 [16];
  undefined1 local_a68 [12];
  float fStack_a5c;
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  uint local_a18;
  uint uStack_a14;
  uint uStack_a10;
  uint uStack_a0c;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  float local_9e8 [4];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined1 local_918 [16];
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined1 local_8f8 [16];
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined1 local_868 [16];
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8;
  ulong local_7d0 [244];
  undefined1 auVar128 [12];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (fVar75 = *(float *)&(This->intersector1).intersect, 0.0 <= fVar75)) {
    local_b28 = local_7d0;
    local_7d8 = *(ulong *)(*(long *)this + 0x70);
    local_948 = *(float *)&This->ptr;
    local_958 = *(float *)((long)&This->ptr + 4);
    local_908 = *(float *)&This->leafIntersector;
    fVar77 = *(float *)((long)&This->leafIntersector + 4);
    CVar25 = This->collider;
    fVar76 = 0.0;
    if (0.0 <= fVar77) {
      fVar76 = fVar77;
    }
    auVar120 = divps(_DAT_01f7ba10,(undefined1  [16])CVar25);
    auVar121._4_4_ = -(uint)(ABS(CVar25.collide._4_4_) < 1e-18);
    auVar121._0_4_ = -(uint)(ABS(CVar25.collide._0_4_) < 1e-18);
    auVar121._8_4_ = -(uint)(ABS(CVar25.name._0_4_) < 1e-18);
    auVar121._12_4_ = -(uint)(ABS(CVar25.name._4_4_) < 1e-18);
    auVar121 = blendvps(auVar120,_DAT_01fab950,auVar121);
    local_968 = auVar121._0_4_ * 0.99999964;
    local_978 = auVar121._4_4_ * 0.99999964;
    local_938 = auVar121._8_4_ * 0.99999964;
    local_988 = auVar121._0_4_ * 1.0000004;
    local_998 = auVar121._4_4_ * 1.0000004;
    local_928 = auVar121._8_4_ * 1.0000004;
    local_b30 = (ulong)(local_968 < 0.0) << 4;
    uVar70 = (ulong)(local_978 < 0.0) << 4 | 0x20;
    uVar60 = (ulong)(local_938 < 0.0) << 4 | 0x40;
    uVar71 = local_b30 ^ 0x10;
    local_918._4_4_ = fVar76;
    local_918._0_4_ = fVar76;
    local_918._8_4_ = fVar76;
    local_918._12_4_ = fVar76;
    local_8f8._4_4_ = fVar75;
    local_8f8._0_4_ = fVar75;
    local_8f8._8_4_ = fVar75;
    local_8f8._12_4_ = fVar75;
    local_7e8 = mm_lookupmask_ps._0_8_;
    uStack_7e0 = mm_lookupmask_ps._8_8_;
    local_878 = mm_lookupmask_ps._240_8_;
    uStack_870 = mm_lookupmask_ps._248_8_;
    fStack_934 = local_938;
    fStack_930 = local_938;
    fStack_92c = local_938;
    fStack_954 = local_958;
    fStack_950 = local_958;
    fStack_94c = local_958;
    fStack_984 = local_988;
    fStack_980 = local_988;
    fStack_97c = local_988;
    fStack_904 = local_908;
    fStack_900 = local_908;
    fStack_8fc = local_908;
    fStack_924 = local_928;
    fStack_920 = local_928;
    fStack_91c = local_928;
    fStack_944 = local_948;
    fStack_940 = local_948;
    fStack_93c = local_948;
    fStack_964 = local_968;
    fStack_960 = local_968;
    fStack_95c = local_968;
    fStack_974 = local_978;
    fStack_970 = local_978;
    fStack_96c = local_978;
    fStack_994 = local_998;
    fStack_990 = local_998;
    fStack_98c = local_998;
    do {
      uVar72 = local_b28[-1];
      local_b28 = local_b28 + -1;
      while ((uVar72 & 8) == 0) {
        fVar75 = *(float *)((long)&(This->collider).name + 4);
        uVar53 = uVar72 & 0xfffffffffffffff0;
        pfVar24 = (float *)(uVar53 + 0x80 + local_b30);
        pfVar23 = (float *)(uVar53 + 0x20 + local_b30);
        auVar120._0_4_ = ((*pfVar24 * fVar75 + *pfVar23) - local_948) * local_968;
        auVar120._4_4_ = ((pfVar24[1] * fVar75 + pfVar23[1]) - fStack_944) * fStack_964;
        auVar120._8_4_ = ((pfVar24[2] * fVar75 + pfVar23[2]) - fStack_940) * fStack_960;
        auVar120._12_4_ = ((pfVar24[3] * fVar75 + pfVar23[3]) - fStack_93c) * fStack_95c;
        auVar121 = maxps(local_918,auVar120);
        pfVar24 = (float *)(uVar53 + 0x80 + uVar70);
        pfVar23 = (float *)(uVar53 + 0x20 + uVar70);
        auVar96._0_4_ = ((*pfVar24 * fVar75 + *pfVar23) - local_958) * local_978;
        auVar96._4_4_ = ((pfVar24[1] * fVar75 + pfVar23[1]) - fStack_954) * fStack_974;
        auVar96._8_4_ = ((pfVar24[2] * fVar75 + pfVar23[2]) - fStack_950) * fStack_970;
        auVar96._12_4_ = ((pfVar24[3] * fVar75 + pfVar23[3]) - fStack_94c) * fStack_96c;
        pfVar24 = (float *)(uVar53 + 0x80 + uVar60);
        pfVar23 = (float *)(uVar53 + 0x20 + uVar60);
        auVar93._0_4_ = ((*pfVar24 * fVar75 + *pfVar23) - local_908) * local_938;
        auVar93._4_4_ = ((pfVar24[1] * fVar75 + pfVar23[1]) - fStack_904) * fStack_934;
        auVar93._8_4_ = ((pfVar24[2] * fVar75 + pfVar23[2]) - fStack_900) * fStack_930;
        auVar93._12_4_ = ((pfVar24[3] * fVar75 + pfVar23[3]) - fStack_8fc) * fStack_92c;
        auVar120 = maxps(auVar96,auVar93);
        auVar121 = maxps(auVar121,auVar120);
        pfVar24 = (float *)(uVar53 + 0x80 + uVar71);
        pfVar23 = (float *)(uVar53 + 0x20 + uVar71);
        auVar94._0_4_ = ((*pfVar24 * fVar75 + *pfVar23) - local_948) * local_988;
        auVar94._4_4_ = ((pfVar24[1] * fVar75 + pfVar23[1]) - fStack_944) * fStack_984;
        auVar94._8_4_ = ((pfVar24[2] * fVar75 + pfVar23[2]) - fStack_940) * fStack_980;
        auVar94._12_4_ = ((pfVar24[3] * fVar75 + pfVar23[3]) - fStack_93c) * fStack_97c;
        auVar120 = minps(local_8f8,auVar94);
        pfVar24 = (float *)(uVar53 + 0x80 + (uVar70 ^ 0x10));
        pfVar23 = (float *)(uVar53 + 0x20 + (uVar70 ^ 0x10));
        auVar95._0_4_ = ((*pfVar24 * fVar75 + *pfVar23) - local_958) * local_998;
        auVar95._4_4_ = ((pfVar24[1] * fVar75 + pfVar23[1]) - fStack_954) * fStack_994;
        auVar95._8_4_ = ((pfVar24[2] * fVar75 + pfVar23[2]) - fStack_950) * fStack_990;
        auVar95._12_4_ = ((pfVar24[3] * fVar75 + pfVar23[3]) - fStack_94c) * fStack_98c;
        pfVar24 = (float *)(uVar53 + 0x80 + (uVar60 ^ 0x10));
        pfVar23 = (float *)(uVar53 + 0x20 + (uVar60 ^ 0x10));
        auVar100._0_4_ = ((*pfVar24 * fVar75 + *pfVar23) - local_908) * local_928;
        auVar100._4_4_ = ((pfVar24[1] * fVar75 + pfVar23[1]) - fStack_904) * fStack_924;
        auVar100._8_4_ = ((pfVar24[2] * fVar75 + pfVar23[2]) - fStack_900) * fStack_920;
        auVar100._12_4_ = ((pfVar24[3] * fVar75 + pfVar23[3]) - fStack_8fc) * fStack_91c;
        auVar96 = minps(auVar95,auVar100);
        auVar120 = minps(auVar120,auVar96);
        bVar32 = auVar121._0_4_ <= auVar120._0_4_;
        bVar33 = auVar121._4_4_ <= auVar120._4_4_;
        bVar34 = auVar121._8_4_ <= auVar120._8_4_;
        bVar35 = auVar121._12_4_ <= auVar120._12_4_;
        if (((uint)uVar72 & 7) == 6) {
          bVar32 = (fVar75 < *(float *)(uVar53 + 0xf0) && *(float *)(uVar53 + 0xe0) <= fVar75) &&
                   bVar32;
          bVar33 = (fVar75 < *(float *)(uVar53 + 0xf4) && *(float *)(uVar53 + 0xe4) <= fVar75) &&
                   bVar33;
          bVar34 = (fVar75 < *(float *)(uVar53 + 0xf8) && *(float *)(uVar53 + 0xe8) <= fVar75) &&
                   bVar34;
          bVar35 = (fVar75 < *(float *)(uVar53 + 0xfc) && *(float *)(uVar53 + 0xec) <= fVar75) &&
                   bVar35;
        }
        auVar79._0_4_ = (uint)bVar32 * -0x80000000;
        auVar79._4_4_ = (uint)bVar33 * -0x80000000;
        auVar79._8_4_ = (uint)bVar34 * -0x80000000;
        auVar79._12_4_ = (uint)bVar35 * -0x80000000;
        uVar56 = movmskps((int)context,auVar79);
        context = (RayQueryContext *)(ulong)uVar56;
        if (uVar56 == 0) goto LAB_00225831;
        context = (RayQueryContext *)(ulong)(byte)uVar56;
        lVar65 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((byte)uVar56 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
          }
        }
        uVar72 = *(ulong *)(uVar53 + lVar65 * 8);
        uVar56 = (uVar56 & 0xff) - 1 & uVar56 & 0xff;
        if (uVar56 != 0) {
          *local_b28 = uVar72;
          local_b28 = local_b28 + 1;
          lVar65 = 0;
          if (uVar56 != 0) {
            for (; (uVar56 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
            }
          }
          uVar72 = *(ulong *)(uVar53 + lVar65 * 8);
          uVar56 = uVar56 - 1 & uVar56;
          context = (RayQueryContext *)(ulong)uVar56;
          if (uVar56 != 0) {
            do {
              *local_b28 = uVar72;
              local_b28 = local_b28 + 1;
              lVar65 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; ((ulong)context >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              uVar72 = *(ulong *)(uVar53 + lVar65 * 8);
              context = (RayQueryContext *)((ulong)context & (ulong)((long)&context[-1].args + 7U));
            } while (context != (RayQueryContext *)0x0);
          }
        }
      }
      local_b38 = (RayQueryContext *)((ulong)((uint)uVar72 & 0xf) - 8);
      if (local_b38 != (RayQueryContext *)0x0) {
        uVar72 = uVar72 & 0xfffffffffffffff0;
        context = (RayQueryContext *)0x0;
        local_cb0 = This;
        local_c90 = ray;
        do {
          local_b20 = context;
          lVar66 = (long)context * 0x60;
          lVar65 = *(long *)&(ray->org).field_0;
          local_c80 = lVar65;
          lVar67 = *(long *)(lVar65 + 0x1e8);
          lVar26 = *(long *)(lVar67 + (ulong)*(uint *)(uVar72 + 0x40 + lVar66) * 8);
          fVar75 = *(float *)(lVar26 + 0x2c);
          local_888 = ((*(float *)((long)&(This->collider).name + 4) - fVar75) /
                      (*(float *)(lVar26 + 0x30) - fVar75)) * *(float *)(lVar26 + 0x28);
          auVar80 = roundss(ZEXT416((uint)fVar75),ZEXT416((uint)local_888),9);
          fVar75 = *(float *)(lVar26 + 0x28) + -1.0;
          if (fVar75 <= auVar80._0_4_) {
            auVar80._0_4_ = fVar75;
          }
          fVar75 = 0.0;
          if (0.0 <= auVar80._0_4_) {
            fVar75 = auVar80._0_4_;
          }
          local_888 = local_888 - fVar75;
          lVar69 = (long)(int)fVar75 * 0x38;
          lVar27 = *(long *)(*(long *)(lVar26 + 0xe0) + lVar69);
          uVar53 = (ulong)*(uint *)(uVar72 + 4 + lVar66);
          pfVar23 = (float *)(lVar27 + (ulong)*(uint *)(uVar72 + lVar66) * 4);
          uVar55 = (ulong)*(uint *)(uVar72 + 0x10 + lVar66);
          pfVar24 = (float *)(lVar27 + uVar55 * 4);
          uVar56 = *(uint *)(uVar72 + 0x30 + lVar66);
          pfVar1 = (float *)(lVar27 + (ulong)uVar56 * 4);
          lVar28 = *(long *)(*(long *)(lVar67 + (ulong)*(uint *)(uVar72 + 0x44 + lVar66) * 8) + 0xe0
                            );
          lVar29 = *(long *)(lVar28 + lVar69);
          pfVar2 = (float *)(lVar29 + uVar53 * 4);
          pfVar3 = (float *)(lVar29 + (ulong)*(uint *)(uVar72 + 0x14 + lVar66) * 4);
          lVar54 = (long)((int)fVar75 + 1) * 0x38;
          lVar26 = *(long *)(*(long *)(lVar26 + 0xe0) + lVar54);
          pfVar4 = (float *)(lVar26 + (ulong)*(uint *)(uVar72 + lVar66) * 4);
          uVar58 = (ulong)*(uint *)(uVar72 + 0x34 + lVar66);
          pfVar5 = (float *)(lVar29 + uVar58 * 4);
          lVar30 = *(long *)(*(long *)(lVar67 + (ulong)*(uint *)(uVar72 + 0x48 + lVar66) * 8) + 0xe0
                            );
          pfVar6 = (float *)(lVar26 + uVar55 * 4);
          lVar31 = *(long *)(lVar30 + lVar69);
          lVar28 = *(long *)(lVar28 + lVar54);
          pfVar7 = (float *)(lVar28 + uVar53 * 4);
          uVar57 = (ulong)*(uint *)(uVar72 + 8 + lVar66);
          uVar53 = *(ulong *)(lVar30 + lVar54);
          pfVar8 = (float *)(uVar53 + uVar57 * 4);
          uVar63 = (ulong)*(uint *)(uVar72 + 0x18 + lVar66);
          puVar9 = (undefined4 *)(lVar31 + uVar63 * 4);
          lVar67 = *(long *)(*(long *)(lVar67 + (ulong)*(uint *)(uVar72 + 0x4c + lVar66) * 8) + 0xe0
                            );
          lVar30 = *(long *)(lVar67 + lVar69);
          lVar54 = *(long *)(lVar67 + lVar54);
          uVar61 = (ulong)*(uint *)(uVar72 + 0x38 + lVar66);
          puVar10 = (undefined4 *)(lVar31 + uVar61 * 4);
          uVar55 = (ulong)*(uint *)(uVar72 + 0xc + lVar66);
          uVar59 = (ulong)*(uint *)(uVar72 + 0x1c + lVar66);
          puVar11 = (undefined4 *)(lVar30 + uVar59 * 4);
          uVar68 = (ulong)*(uint *)(uVar72 + 0x3c + lVar66);
          puVar12 = (undefined4 *)(lVar30 + uVar68 * 4);
          uStack_c98 = *puVar9;
          uStack_c94 = *puVar11;
          pfVar13 = (float *)(lVar54 + uVar55 * 4);
          local_c38 = CONCAT44(*puVar12,*puVar10);
          pfVar14 = (float *)(uVar53 + uVar63 * 4);
          pfVar15 = (float *)(lVar28 + local_c38 * 4);
          pfVar16 = (float *)(lVar54 + uVar59 * 4);
          pfVar17 = (float *)(lVar26 + (ulong)uVar56 * 4);
          pfVar18 = (float *)(uVar53 + uVar61 * 4);
          pfVar19 = (float *)(lVar28 + uVar58 * 4);
          pfVar20 = (float *)(lVar54 + uVar68 * 4);
          local_898 = 1.0 - local_888;
          local_b08 = *pfVar24 * local_898 + *pfVar6 * local_888;
          fStack_b04 = *pfVar3 * local_898 + *pfVar15 * local_888;
          fStack_ca0 = fStack_ca0 * local_898 + *pfVar14 * local_888;
          fStack_c9c = fStack_c9c * local_898 + *pfVar16 * local_888;
          _local_ca8 = CONCAT44(fStack_b04,local_b08);
          local_8d8 = pfVar24[1] * local_898 + pfVar6[1] * local_888;
          fStack_8d4 = pfVar3[1] * local_898 + pfVar15[1] * local_888;
          fStack_8d0 = (float)puVar9[1] * local_898 + pfVar14[1] * local_888;
          fStack_8cc = (float)puVar11[1] * local_898 + pfVar16[1] * local_888;
          local_b18 = pfVar24[2] * local_898 + pfVar6[2] * local_888;
          fStack_b14 = pfVar3[2] * local_898 + pfVar15[2] * local_888;
          fStack_cc0 = (float)puVar9[2] * local_898 + pfVar14[2] * local_888;
          fStack_cbc = (float)puVar11[2] * local_898 + pfVar16[2] * local_888;
          local_cc8 = CONCAT44(fStack_b14,local_b18);
          fStack_884 = local_888;
          fStack_880 = local_888;
          fStack_87c = local_888;
          local_aa8 = *pfVar1 * local_898 + *pfVar17 * local_888;
          fStack_aa4 = *pfVar5 * local_898 + *pfVar19 * local_888;
          fStack_c40 = fStack_c40 * local_898 + *pfVar18 * local_888;
          fStack_c3c = fStack_c3c * local_898 + *pfVar20 * local_888;
          local_8e8 = pfVar1[1] * local_898 + pfVar17[1] * local_888;
          fStack_8e4 = pfVar5[1] * local_898 + pfVar19[1] * local_888;
          fStack_8e0 = (float)puVar10[1] * local_898 + pfVar18[1] * local_888;
          fStack_8dc = (float)puVar12[1] * local_898 + pfVar20[1] * local_888;
          fStack_894 = local_898;
          fStack_890 = local_898;
          fStack_88c = local_898;
          local_8c8 = pfVar1[2] * local_898 + pfVar17[2] * local_888;
          fStack_8c4 = pfVar5[2] * local_898 + pfVar19[2] * local_888;
          fStack_8c0 = (float)puVar10[2] * local_898 + pfVar18[2] * local_888;
          fStack_8bc = (float)puVar12[2] * local_898 + pfVar20[2] * local_888;
          local_ab8 = *(float *)&local_cb0->ptr;
          local_a98 = *(float *)((long)&local_cb0->ptr + 4);
          local_a88 = *(float *)&local_cb0->leafIntersector;
          local_c68._0_4_ = (pfVar23[1] * local_898 + pfVar4[1] * local_888) - local_a98;
          local_c68._4_4_ = (pfVar2[1] * local_898 + pfVar7[1] * local_888) - local_a98;
          fStack_c60 = (*(float *)(lVar31 + uVar57 * 4 + 4) * local_898 + pfVar8[1] * local_888) -
                       local_a98;
          fStack_c5c = (*(float *)(lVar30 + uVar55 * 4 + 4) * local_898 + pfVar13[1] * local_888) -
                       local_a98;
          fVar139 = (pfVar23[2] * local_898 + pfVar4[2] * local_888) - local_a88;
          fVar144 = (pfVar2[2] * local_898 + pfVar7[2] * local_888) - local_a88;
          fVar147 = (fStack_cf0 * local_898 + pfVar8[2] * local_888) - local_a88;
          fVar148 = (fStack_cec * local_898 + pfVar13[2] * local_888) - local_a88;
          local_b48 = local_8e8 - local_a98;
          fStack_b44 = fStack_8e4 - local_a98;
          fStack_b40 = fStack_8e0 - local_a98;
          fStack_b3c = fStack_8dc - local_a98;
          local_b58 = local_8c8 - local_a88;
          fStack_b54 = fStack_8c4 - local_a88;
          fStack_b50 = fStack_8c0 - local_a88;
          fStack_b4c = fStack_8bc - local_a88;
          local_828 = local_b48 - (float)local_c68._0_4_;
          fStack_824 = fStack_b44 - (float)local_c68._4_4_;
          fStack_820 = fStack_b40 - fStack_c60;
          fStack_81c = fStack_b3c - fStack_c5c;
          local_818 = local_b58 - fVar139;
          fStack_814 = fStack_b54 - fVar144;
          fStack_810 = fStack_b50 - fVar147;
          fStack_80c = fStack_b4c - fVar148;
          fVar103 = (*pfVar23 * local_898 + *pfVar4 * local_888) - local_ab8;
          fVar105 = (*pfVar2 * local_898 + *pfVar7 * local_888) - local_ab8;
          fStack_cd0 = (fStack_cd0 * local_898 + *pfVar8 * local_888) - local_ab8;
          fStack_ccc = (fStack_ccc * local_898 + *pfVar13 * local_888) - local_ab8;
          local_cd8 = CONCAT44(fVar105,fVar103);
          local_c48 = CONCAT44(fStack_aa4,local_aa8);
          local_aa8 = local_aa8 - local_ab8;
          fStack_aa4 = fStack_aa4 - local_ab8;
          fStack_aa0 = fStack_c40 - local_ab8;
          fStack_a9c = fStack_c3c - local_ab8;
          local_838 = local_aa8 - fVar103;
          fStack_834 = fStack_aa4 - fVar105;
          fStack_830 = fStack_aa0 - fStack_cd0;
          fStack_82c = fStack_a9c - fStack_ccc;
          local_b68 = *(float *)&(local_cb0->collider).collide;
          local_b98 = *(float *)((long)&(local_cb0->collider).collide + 4);
          fStack_c70 = *(float *)&(local_cb0->collider).name;
          fVar140 = (local_828 * (local_b58 + fVar139) -
                    local_818 * (local_b48 + (float)local_c68._0_4_)) * local_b68 +
                    (local_818 * (local_aa8 + fVar103) - (local_b58 + fVar139) * local_838) *
                    local_b98 +
                    ((local_b48 + (float)local_c68._0_4_) * local_838 -
                    (local_aa8 + fVar103) * local_828) * fStack_c70;
          fVar145 = (fStack_824 * (fStack_b54 + fVar144) -
                    fStack_814 * (fStack_b44 + (float)local_c68._4_4_)) * local_b68 +
                    (fStack_814 * (fStack_aa4 + fVar105) - (fStack_b54 + fVar144) * fStack_834) *
                    local_b98 +
                    ((fStack_b44 + (float)local_c68._4_4_) * fStack_834 -
                    (fStack_aa4 + fVar105) * fStack_824) * fStack_c70;
          local_a78._0_8_ = CONCAT44(fVar145,fVar140);
          local_a78._8_4_ =
               (fStack_820 * (fStack_b50 + fVar147) - fStack_810 * (fStack_b40 + fStack_c60)) *
               local_b68 +
               (fStack_810 * (fStack_aa0 + fStack_cd0) - (fStack_b50 + fVar147) * fStack_830) *
               local_b98 +
               ((fStack_b40 + fStack_c60) * fStack_830 - (fStack_aa0 + fStack_cd0) * fStack_820) *
               fStack_c70;
          local_a78._12_4_ =
               (fStack_81c * (fStack_b4c + fVar148) - fStack_80c * (fStack_b3c + fStack_c5c)) *
               local_b68 +
               (fStack_80c * (fStack_a9c + fStack_ccc) - (fStack_b4c + fVar148) * fStack_82c) *
               local_b98 +
               ((fStack_b3c + fStack_c5c) * fStack_82c - (fStack_a9c + fStack_ccc) * fStack_81c) *
               fStack_c70;
          fStack_a94 = local_a98;
          fStack_a90 = local_a98;
          fStack_a8c = local_a98;
          local_af8 = local_8d8 - local_a98;
          fStack_af4 = fStack_8d4 - local_a98;
          fStack_af0 = fStack_8d0 - local_a98;
          fStack_aec = fStack_8cc - local_a98;
          fStack_a84 = local_a88;
          fStack_a80 = local_a88;
          fStack_a7c = local_a88;
          local_b18 = local_b18 - local_a88;
          fStack_b14 = fStack_b14 - local_a88;
          fStack_b10 = fStack_cc0 - local_a88;
          fStack_b0c = fStack_cbc - local_a88;
          local_7f8 = (float)local_c68._0_4_ - local_af8;
          fStack_7f4 = (float)local_c68._4_4_ - fStack_af4;
          fStack_7f0 = fStack_c60 - fStack_af0;
          fStack_7ec = fStack_c5c - fStack_aec;
          local_808 = fVar139 - local_b18;
          fStack_804 = fVar144 - fStack_b14;
          fStack_800 = fVar147 - fStack_b10;
          fStack_7fc = fVar148 - fStack_b0c;
          fStack_ab4 = local_ab8;
          fStack_ab0 = local_ab8;
          fStack_aac = local_ab8;
          local_b08 = local_b08 - local_ab8;
          fStack_b04 = fStack_b04 - local_ab8;
          fStack_b00 = fStack_ca0 - local_ab8;
          fStack_afc = fStack_c9c - local_ab8;
          local_858 = fVar103 - local_b08;
          fStack_854 = fVar105 - fStack_b04;
          fStack_850 = fStack_cd0 - fStack_b00;
          fStack_84c = fStack_ccc - fStack_afc;
          fVar99 = (local_7f8 * (fVar139 + local_b18) -
                   local_808 * ((float)local_c68._0_4_ + local_af8)) * local_b68 +
                   (local_808 * (fVar103 + local_b08) - (fVar139 + local_b18) * local_858) *
                   local_b98 +
                   (((float)local_c68._0_4_ + local_af8) * local_858 -
                   (fVar103 + local_b08) * local_7f8) * fStack_c70;
          fVar102 = (fStack_7f4 * (fVar144 + fStack_b14) -
                    fStack_804 * ((float)local_c68._4_4_ + fStack_af4)) * local_b68 +
                    (fStack_804 * (fVar105 + fStack_b04) - (fVar144 + fStack_b14) * fStack_854) *
                    local_b98 +
                    (((float)local_c68._4_4_ + fStack_af4) * fStack_854 -
                    (fVar105 + fStack_b04) * fStack_7f4) * fStack_c70;
          local_868._0_8_ = CONCAT44(fVar102,fVar99);
          local_868._8_4_ =
               (fStack_7f0 * (fVar147 + fStack_b10) - fStack_800 * (fStack_c60 + fStack_af0)) *
               local_b68 +
               (fStack_800 * (fStack_cd0 + fStack_b00) - (fVar147 + fStack_b10) * fStack_850) *
               local_b98 +
               ((fStack_c60 + fStack_af0) * fStack_850 - (fStack_cd0 + fStack_b00) * fStack_7f0) *
               fStack_c70;
          local_868._12_4_ =
               (fStack_7ec * (fVar148 + fStack_b0c) - fStack_7fc * (fStack_c5c + fStack_aec)) *
               local_b68 +
               (fStack_7fc * (fStack_ccc + fStack_afc) - (fVar148 + fStack_b0c) * fStack_84c) *
               local_b98 +
               ((fStack_c5c + fStack_aec) * fStack_84c - (fStack_ccc + fStack_afc) * fStack_7ec) *
               fStack_c70;
          fVar149 = local_af8 - local_b48;
          fVar152 = fStack_af4 - fStack_b44;
          fStack_c30 = fStack_af0 - fStack_b40;
          fStack_c2c = fStack_aec - fStack_b3c;
          local_848 = local_b18 - local_b58;
          fStack_844 = fStack_b14 - fStack_b54;
          fStack_840 = fStack_b10 - fStack_b50;
          fStack_83c = fStack_b0c - fStack_b4c;
          local_ac8 = local_af8 + local_b48;
          fStack_ac4 = fStack_af4 + fStack_b44;
          fStack_ac0 = fStack_af0 + fStack_b40;
          fStack_abc = fStack_aec + fStack_b3c;
          local_ad8 = local_b18 + local_b58;
          fStack_ad4 = fStack_b14 + fStack_b54;
          fStack_ad0 = fStack_b10 + fStack_b50;
          fStack_acc = fStack_b0c + fStack_b4c;
          fVar106 = local_b08 - local_aa8;
          fVar108 = fStack_b04 - fStack_aa4;
          fVar109 = fStack_b00 - fStack_aa0;
          fVar111 = fStack_afc - fStack_a9c;
          local_ae8 = local_b08 + local_aa8;
          fStack_ae4 = fStack_b04 + fStack_aa4;
          fStack_ae0 = fStack_b00 + fStack_aa0;
          fStack_adc = fStack_afc + fStack_a9c;
          local_c38 = CONCAT44(fVar152,fVar149);
          local_c78 = (byte *)CONCAT44(fStack_c70,fStack_c70);
          fStack_c6c = fStack_c70;
          fStack_b94 = local_b98;
          fStack_b90 = local_b98;
          fStack_b8c = local_b98;
          fStack_b64 = local_b68;
          fStack_b60 = local_b68;
          fStack_b5c = local_b68;
          fVar75 = (fVar149 * local_ad8 - local_848 * local_ac8) * local_b68 +
                   (local_848 * local_ae8 - fVar106 * local_ad8) * local_b98 +
                   (fVar106 * local_ac8 - fVar149 * local_ae8) * fStack_c70;
          fVar76 = (fVar152 * fStack_ad4 - fStack_844 * fStack_ac4) * local_b68 +
                   (fStack_844 * fStack_ae4 - fVar108 * fStack_ad4) * local_b98 +
                   (fVar108 * fStack_ac4 - fVar152 * fStack_ae4) * fStack_c70;
          fVar77 = (fStack_c30 * fStack_ad0 - fStack_840 * fStack_ac0) * local_b68 +
                   (fStack_840 * fStack_ae0 - fVar109 * fStack_ad0) * local_b98 +
                   (fVar109 * fStack_ac0 - fStack_c30 * fStack_ae0) * fStack_c70;
          fVar78 = (fStack_c2c * fStack_acc - fStack_83c * fStack_abc) * local_b68 +
                   (fStack_83c * fStack_adc - fVar111 * fStack_acc) * local_b98 +
                   (fVar111 * fStack_abc - fStack_c2c * fStack_adc) * fStack_c70;
          local_a58._0_4_ = fVar140 + fVar99 + fVar75;
          local_a58._4_4_ = fVar145 + fVar102 + fVar76;
          local_a58._8_4_ = local_a78._8_4_ + local_868._8_4_ + fVar77;
          local_a58._12_4_ = local_a78._12_4_ + local_868._12_4_ + fVar78;
          auVar81._8_4_ = local_a78._8_4_;
          auVar81._0_8_ = local_a78._0_8_;
          auVar81._12_4_ = local_a78._12_4_;
          auVar121 = minps(auVar81,local_868);
          auVar36._4_4_ = fVar76;
          auVar36._0_4_ = fVar75;
          auVar36._8_4_ = fVar77;
          auVar36._12_4_ = fVar78;
          auVar121 = minps(auVar121,auVar36);
          auVar129._8_4_ = local_a78._8_4_;
          auVar129._0_8_ = local_a78._0_8_;
          auVar129._12_4_ = local_a78._12_4_;
          auVar120 = maxps(auVar129,local_868);
          auVar37._4_4_ = fVar76;
          auVar37._0_4_ = fVar75;
          auVar37._8_4_ = fVar77;
          auVar37._12_4_ = fVar78;
          auVar120 = maxps(auVar120,auVar37);
          fVar75 = ABS(local_a58._0_4_) * 1.1920929e-07;
          fVar76 = ABS(local_a58._4_4_) * 1.1920929e-07;
          fVar77 = ABS(local_a58._8_4_) * 1.1920929e-07;
          fVar78 = ABS(local_a58._12_4_) * 1.1920929e-07;
          auVar130._4_4_ = -(uint)(auVar120._4_4_ <= fVar76);
          auVar130._0_4_ = -(uint)(auVar120._0_4_ <= fVar75);
          auVar130._8_4_ = -(uint)(auVar120._8_4_ <= fVar77);
          auVar130._12_4_ = -(uint)(auVar120._12_4_ <= fVar78);
          auVar82._4_4_ = -(uint)(-fVar76 <= auVar121._4_4_);
          auVar82._0_4_ = -(uint)(-fVar75 <= auVar121._0_4_);
          auVar82._8_4_ = -(uint)(-fVar77 <= auVar121._8_4_);
          auVar82._12_4_ = -(uint)(-fVar78 <= auVar121._12_4_);
          auVar130 = auVar130 | auVar82;
          lVar67 = uVar72 + lVar66;
          local_c88 = lVar67;
          uVar55 = (ulong)*(uint *)(uVar72 + 0x20 + lVar66);
          uVar57 = (ulong)*(uint *)(uVar72 + 0x24 + lVar66);
          uVar58 = (ulong)*(uint *)(uVar72 + 0x28 + lVar66);
          uVar59 = (ulong)*(uint *)(uVar72 + 0x2c + lVar66);
          iVar62 = movmskps(uVar56,auVar130);
          pauVar21 = (undefined1 (*) [12])(lVar27 + uVar55 * 4);
          auVar128 = *pauVar21;
          local_c58 = (float)*(undefined8 *)*pauVar21;
          fStack_c54 = (float)((ulong)*(undefined8 *)*pauVar21 >> 0x20);
          fStack_c50 = (float)*(undefined8 *)(*pauVar21 + 8);
          fStack_c4c = (float)((ulong)*(undefined8 *)(*pauVar21 + 8) >> 0x20);
          puVar22 = (undefined8 *)(lVar26 + uVar55 * 4);
          local_c08 = *puVar22;
          uStack_c00 = puVar22[1];
          puVar22 = (undefined8 *)(lVar29 + uVar57 * 4);
          local_8a8 = *puVar22;
          uStack_8a0 = puVar22[1];
          _local_c28 = *(undefined1 (*) [16])(lVar28 + uVar57 * 4);
          auVar121 = _local_c28;
          puVar22 = (undefined8 *)(lVar31 + uVar58 * 4);
          local_8b8 = *puVar22;
          uStack_8b0 = puVar22[1];
          puVar22 = (undefined8 *)(uVar53 + uVar58 * 4);
          local_b78 = *puVar22;
          uStack_b70 = puVar22[1];
          puVar22 = (undefined8 *)(lVar30 + uVar59 * 4);
          local_b88 = *puVar22;
          uStack_b80 = puVar22[1];
          puVar22 = (undefined8 *)(lVar54 + uVar59 * 4);
          local_c18 = *puVar22;
          uStack_c10 = puVar22[1];
          ray = local_c90;
          This = local_cb0;
          if (iVar62 != 0) {
            auVar114._0_4_ = local_7f8 * local_848 - local_808 * fVar149;
            auVar114._4_4_ = fStack_7f4 * fStack_844 - fStack_804 * fVar152;
            auVar114._8_4_ = fStack_7f0 * fStack_840 - fStack_800 * fStack_c30;
            auVar114._12_4_ = fStack_7ec * fStack_83c - fStack_7fc * fStack_c2c;
            auVar38._4_4_ = -(uint)(ABS(fStack_814 * fStack_7f4) < ABS(fStack_804 * fVar152));
            auVar38._0_4_ = -(uint)(ABS(local_818 * local_7f8) < ABS(local_808 * fVar149));
            auVar38._8_4_ = -(uint)(ABS(fStack_810 * fStack_7f0) < ABS(fStack_800 * fStack_c30));
            auVar38._12_4_ = -(uint)(ABS(fStack_80c * fStack_7ec) < ABS(fStack_7fc * fStack_c2c));
            auVar48._4_4_ = fStack_824 * fStack_804 - fStack_814 * fStack_7f4;
            auVar48._0_4_ = local_828 * local_808 - local_818 * local_7f8;
            auVar48._8_4_ = fStack_820 * fStack_800 - fStack_810 * fStack_7f0;
            auVar48._12_4_ = fStack_81c * fStack_7fc - fStack_80c * fStack_7ec;
            local_a48 = blendvps(auVar114,auVar48,auVar38);
            auVar150._0_4_ = local_818 * local_858 - local_838 * local_808;
            auVar150._4_4_ = fStack_814 * fStack_854 - fStack_834 * fStack_804;
            auVar150._8_4_ = fStack_810 * fStack_850 - fStack_830 * fStack_800;
            auVar150._12_4_ = fStack_80c * fStack_84c - fStack_82c * fStack_7fc;
            auVar101._0_4_ = local_808 * fVar106 - local_858 * local_848;
            auVar101._4_4_ = fStack_804 * fVar108 - fStack_854 * fStack_844;
            auVar101._8_4_ = fStack_800 * fVar109 - fStack_850 * fStack_840;
            auVar101._12_4_ = fStack_7fc * fVar111 - fStack_84c * fStack_83c;
            auVar39._4_4_ = -(uint)(ABS(fStack_834 * fStack_804) < ABS(fStack_854 * fStack_844));
            auVar39._0_4_ = -(uint)(ABS(local_838 * local_808) < ABS(local_858 * local_848));
            auVar39._8_4_ = -(uint)(ABS(fStack_830 * fStack_800) < ABS(fStack_850 * fStack_840));
            auVar39._12_4_ = -(uint)(ABS(fStack_82c * fStack_7fc) < ABS(fStack_84c * fStack_83c));
            local_a38 = blendvps(auVar101,auVar150,auVar39);
            auVar122._0_4_ = local_838 * local_7f8 - local_828 * local_858;
            auVar122._4_4_ = fStack_834 * fStack_7f4 - fStack_824 * fStack_854;
            auVar122._8_4_ = fStack_830 * fStack_7f0 - fStack_820 * fStack_850;
            auVar122._12_4_ = fStack_82c * fStack_7ec - fStack_81c * fStack_84c;
            auVar107._0_4_ = local_858 * fVar149 - local_7f8 * fVar106;
            auVar107._4_4_ = fStack_854 * fVar152 - fStack_7f4 * fVar108;
            auVar107._8_4_ = fStack_850 * fStack_c30 - fStack_7f0 * fVar109;
            auVar107._12_4_ = fStack_84c * fStack_c2c - fStack_7ec * fVar111;
            auVar40._4_4_ = -(uint)(ABS(fStack_824 * fStack_854) < ABS(fStack_7f4 * fVar108));
            auVar40._0_4_ = -(uint)(ABS(local_828 * local_858) < ABS(local_7f8 * fVar106));
            auVar40._8_4_ = -(uint)(ABS(fStack_820 * fStack_850) < ABS(fStack_7f0 * fVar109));
            auVar40._12_4_ = -(uint)(ABS(fStack_81c * fStack_84c) < ABS(fStack_7ec * fVar111));
            local_a28 = blendvps(auVar107,auVar122,auVar40);
            fVar77 = local_b68 * local_a48._0_4_ +
                     local_b98 * local_a38._0_4_ + fStack_c70 * local_a28._0_4_;
            fVar78 = local_b68 * local_a48._4_4_ +
                     local_b98 * local_a38._4_4_ + fStack_c70 * local_a28._4_4_;
            fVar106 = local_b68 * local_a48._8_4_ +
                      local_b98 * local_a38._8_4_ + fStack_c70 * local_a28._8_4_;
            fVar108 = local_b68 * local_a48._12_4_ +
                      local_b98 * local_a38._12_4_ + fStack_c70 * local_a28._12_4_;
            fVar77 = fVar77 + fVar77;
            fVar78 = fVar78 + fVar78;
            fVar106 = fVar106 + fVar106;
            fVar108 = fVar108 + fVar108;
            auVar88._0_4_ = (float)local_c68._0_4_ * local_a38._0_4_ + fVar139 * local_a28._0_4_;
            auVar88._4_4_ = (float)local_c68._4_4_ * local_a38._4_4_ + fVar144 * local_a28._4_4_;
            auVar88._8_4_ = fStack_c60 * local_a38._8_4_ + fVar147 * local_a28._8_4_;
            auVar88._12_4_ = fStack_c5c * local_a38._12_4_ + fVar148 * local_a28._12_4_;
            fVar147 = fVar103 * local_a48._0_4_ + auVar88._0_4_;
            fVar148 = fVar105 * local_a48._4_4_ + auVar88._4_4_;
            fVar149 = fStack_cd0 * local_a48._8_4_ + auVar88._8_4_;
            fVar152 = fStack_ccc * local_a48._12_4_ + auVar88._12_4_;
            auVar41._4_4_ = fVar78;
            auVar41._0_4_ = fVar77;
            auVar41._8_4_ = fVar106;
            auVar41._12_4_ = fVar108;
            auVar120 = rcpps(auVar88,auVar41);
            fVar75 = auVar120._0_4_;
            fVar76 = auVar120._4_4_;
            fVar105 = auVar120._8_4_;
            fVar109 = auVar120._12_4_;
            fVar111 = (float)DAT_01f7ba10;
            fVar139 = DAT_01f7ba10._4_4_;
            fVar144 = DAT_01f7ba10._12_4_;
            fVar103 = DAT_01f7ba10._8_4_;
            local_9e8[0] = ((fVar111 - fVar77 * fVar75) * fVar75 + fVar75) * (fVar147 + fVar147);
            local_9e8[1] = ((fVar139 - fVar78 * fVar76) * fVar76 + fVar76) * (fVar148 + fVar148);
            local_9e8[2] = ((fVar103 - fVar106 * fVar105) * fVar105 + fVar105) * (fVar149 + fVar149)
            ;
            local_9e8[3] = ((fVar144 - fVar108 * fVar109) * fVar109 + fVar109) * (fVar152 + fVar152)
            ;
            fVar75 = *(float *)&(local_cb0->intersector1).intersect;
            fVar76 = *(float *)((long)&local_cb0->leafIntersector + 4);
            auVar89._4_4_ = -(uint)(fVar76 <= local_9e8[1]);
            auVar89._0_4_ = -(uint)(fVar76 <= local_9e8[0]);
            auVar89._8_4_ = -(uint)(fVar76 <= local_9e8[2]);
            auVar89._12_4_ = -(uint)(fVar76 <= local_9e8[3]);
            local_a18 = -(uint)(fVar77 != 0.0) & auVar130._0_4_ &
                        -(uint)(local_9e8[0] <= fVar75 && fVar76 <= local_9e8[0]);
            uStack_a14 = -(uint)(fVar78 != 0.0) & auVar130._4_4_ &
                         -(uint)(local_9e8[1] <= fVar75 && fVar76 <= local_9e8[1]);
            uStack_a10 = -(uint)(fVar106 != 0.0) & auVar130._8_4_ &
                         -(uint)(local_9e8[2] <= fVar75 && fVar76 <= local_9e8[2]);
            uStack_a0c = -(uint)(fVar108 != 0.0) & auVar130._12_4_ &
                         -(uint)(local_9e8[3] <= fVar75 && fVar76 <= local_9e8[3]);
            auVar42._4_4_ = uStack_a14;
            auVar42._0_4_ = local_a18;
            auVar42._8_4_ = uStack_a10;
            auVar42._12_4_ = uStack_a0c;
            uVar56 = movmskps((int)uVar53,auVar42);
            auVar131._12_4_ = fStack_c4c;
            auVar131._0_12_ = *pauVar21;
            uVar53 = (ulong)uVar56;
            auVar128 = *pauVar21;
            if (uVar56 != 0) {
              local_a68._8_4_ = local_868._8_4_;
              local_a68._0_8_ = local_868._0_8_;
              fStack_a5c = local_868._12_4_;
              local_9a8._8_8_ = uStack_7e0;
              local_9a8._0_8_ = local_7e8;
              auVar120 = rcpps(auVar89,local_a58);
              fVar75 = auVar120._0_4_;
              fVar76 = auVar120._4_4_;
              fVar77 = auVar120._8_4_;
              fVar78 = auVar120._12_4_;
              fVar75 = (float)(-(uint)(1e-18 <= ABS(local_a58._0_4_)) &
                              (uint)((fVar111 - local_a58._0_4_ * fVar75) * fVar75 + fVar75));
              fVar76 = (float)(-(uint)(1e-18 <= ABS(local_a58._4_4_)) &
                              (uint)((fVar139 - local_a58._4_4_ * fVar76) * fVar76 + fVar76));
              fVar77 = (float)(-(uint)(1e-18 <= ABS(local_a58._8_4_)) &
                              (uint)((fVar103 - local_a58._8_4_ * fVar77) * fVar77 + fVar77));
              fVar78 = (float)(-(uint)(1e-18 <= ABS(local_a58._12_4_)) &
                              (uint)((fVar144 - local_a58._12_4_ * fVar78) * fVar78 + fVar78));
              auVar142._0_4_ = fVar140 * fVar75;
              auVar142._4_4_ = fVar145 * fVar76;
              auVar142._8_4_ = local_a78._8_4_ * fVar77;
              auVar142._12_4_ = local_a78._12_4_ * fVar78;
              auVar96 = minps(auVar142,_DAT_01f7ba10);
              auVar97._0_4_ = fVar75 * fVar99;
              auVar97._4_4_ = fVar76 * fVar102;
              auVar97._8_4_ = fVar77 * local_868._8_4_;
              auVar97._12_4_ = fVar78 * local_868._12_4_;
              auVar120 = minps(auVar97,_DAT_01f7ba10);
              auVar83._0_4_ = fVar111 - auVar96._0_4_;
              auVar83._4_4_ = fVar139 - auVar96._4_4_;
              auVar83._8_4_ = fVar103 - auVar96._8_4_;
              auVar83._12_4_ = fVar144 - auVar96._12_4_;
              auVar90._0_4_ = fVar111 - auVar120._0_4_;
              auVar90._4_4_ = fVar139 - auVar120._4_4_;
              auVar90._8_4_ = fVar103 - auVar120._8_4_;
              auVar90._12_4_ = fVar144 - auVar120._12_4_;
              local_a08 = blendvps(auVar96,auVar83,local_9a8);
              local_9f8 = blendvps(auVar120,auVar90,local_9a8);
              local_9d8 = local_a48;
              local_9c8 = local_a38;
              local_9b8 = local_a28;
              uVar53 = (ulong)(byte)uVar56;
              local_bb0 = local_cb0;
              _local_c28 = auVar121;
              do {
                uVar55 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                  }
                }
                local_be0 = *(uint *)(lVar67 + 0x40 + uVar55 * 4);
                local_cd8 = (ulong)local_be0;
                lVar26 = *(long *)(*(long *)(lVar65 + 0x1e8) + local_cd8 * 8);
                if ((*(uint *)(lVar26 + 0x34) &
                    *(uint *)((long)&(local_bb0->intersector1).intersect + 4)) != 0) {
                  pbVar64 = *(byte **)&(ray->dir).field_0;
                  if ((*(long *)(pbVar64 + 0x10) == 0) &&
                     (This = local_bb0, *(long *)(lVar26 + 0x48) == 0)) goto LAB_00225841;
                  local_bb8 = *(undefined4 **)((long)&(ray->org).field_0 + 8);
                  local_bf8 = *(undefined4 *)(local_9d8 + uVar55 * 4);
                  local_bf4 = *(undefined4 *)(local_9c8 + uVar55 * 4);
                  local_bf0 = *(undefined4 *)(local_9b8 + uVar55 * 4);
                  local_bec = *(undefined4 *)(local_a08 + uVar55 * 4);
                  local_be8 = local_9e8[uVar55 - 4];
                  local_be4 = *(undefined4 *)(lVar67 + 0x50 + uVar55 * 4);
                  local_bdc = *local_bb8;
                  local_bd8 = local_bb8[1];
                  local_c68._0_4_ = *(undefined4 *)&(local_bb0->intersector1).intersect;
                  local_cd8 = uVar55;
                  *(float *)&(local_bb0->intersector1).intersect = local_9e8[uVar55];
                  local_cdc = -1;
                  local_bc8 = &local_cdc;
                  local_bc0 = *(undefined8 *)(lVar26 + 0x18);
                  local_ba8 = &local_bf8;
                  local_ba0 = 1;
                  local_c38 = lVar26;
                  if (((*(code **)(lVar26 + 0x48) == (code *)0x0) ||
                      (local_c78 = pbVar64, (**(code **)(lVar26 + 0x48))(&local_bc8),
                      pbVar64 = local_c78, *local_bc8 != 0)) &&
                     ((This = local_cb0, *(code **)(pbVar64 + 0x10) == (code *)0x0 ||
                      ((((*pbVar64 & 2) == 0 && ((*(byte *)(local_c38 + 0x3e) & 0x40) == 0)) ||
                       ((**(code **)(pbVar64 + 0x10))(&local_bc8), This = local_cb0, *local_bc8 != 0
                       )))))) goto LAB_00225841;
                  *(undefined4 *)&(local_cb0->intersector1).intersect = local_c68._0_4_;
                  auVar131._4_4_ = fStack_c54;
                  auVar131._0_4_ = local_c58;
                  auVar131._8_4_ = fStack_c50;
                  auVar131._12_4_ = fStack_c4c;
                  ray = local_c90;
                  local_bb0 = local_cb0;
                  lVar65 = local_c80;
                  lVar67 = local_c88;
                  uVar55 = local_cd8;
                }
                uVar53 = uVar53 ^ 1L << (uVar55 & 0x3f);
                auVar128 = auVar131._0_12_;
              } while (uVar53 != 0);
              local_ab8 = *(float *)&local_bb0->ptr;
              local_a98 = *(float *)((long)&local_bb0->ptr + 4);
              local_a88 = *(float *)&local_bb0->leafIntersector;
              local_b68 = *(float *)&(local_bb0->collider).collide;
              local_b98 = *(float *)((long)&(local_bb0->collider).collide + 4);
              fStack_c70 = *(float *)&(local_bb0->collider).name;
              fStack_b64 = local_b68;
              fStack_b60 = local_b68;
              fStack_b5c = local_b68;
              fStack_b94 = local_b98;
              fStack_b90 = local_b98;
              fStack_b8c = local_b98;
              fStack_ab4 = local_ab8;
              fStack_ab0 = local_ab8;
              fStack_aac = local_ab8;
              fStack_a94 = local_a98;
              fStack_a90 = local_a98;
              fStack_a8c = local_a98;
              fStack_a84 = local_a88;
              fStack_a80 = local_a88;
              fStack_a7c = local_a88;
              local_ae8 = ((float)local_c48 - local_ab8) + (local_ca8 - local_ab8);
              fStack_ae4 = (local_c48._4_4_ - local_ab8) + (fStack_ca4 - local_ab8);
              fStack_ae0 = (fStack_c40 - local_ab8) + (fStack_ca0 - local_ab8);
              fStack_adc = (fStack_c3c - local_ab8) + (fStack_c9c - local_ab8);
              local_ac8 = (local_8e8 - local_a98) + (local_8d8 - local_a98);
              fStack_ac4 = (fStack_8e4 - local_a98) + (fStack_8d4 - local_a98);
              fStack_ac0 = (fStack_8e0 - local_a98) + (fStack_8d0 - local_a98);
              fStack_abc = (fStack_8dc - local_a98) + (fStack_8cc - local_a98);
              local_ad8 = (local_8c8 - local_a88) + ((float)local_cc8 - local_a88);
              fStack_ad4 = (fStack_8c4 - local_a88) + (local_cc8._4_4_ - local_a88);
              fStack_ad0 = (fStack_8c0 - local_a88) + (fStack_cc0 - local_a88);
              fStack_acc = (fStack_8bc - local_a88) + (fStack_cbc - local_a88);
              local_b18 = (float)local_cc8 - local_a88;
              fStack_b14 = local_cc8._4_4_ - local_a88;
              fStack_b10 = fStack_cc0 - local_a88;
              fStack_b0c = fStack_cbc - local_a88;
              local_af8 = local_8d8 - local_a98;
              fStack_af4 = fStack_8d4 - local_a98;
              fStack_af0 = fStack_8d0 - local_a98;
              fStack_aec = fStack_8cc - local_a98;
              local_b08 = local_ca8 - local_ab8;
              fStack_b04 = fStack_ca4 - local_ab8;
              fStack_b00 = fStack_ca0 - local_ab8;
              fStack_afc = fStack_c9c - local_ab8;
              local_b58 = local_8c8 - local_a88;
              fStack_b54 = fStack_8c4 - local_a88;
              fStack_b50 = fStack_8c0 - local_a88;
              fStack_b4c = fStack_8bc - local_a88;
              local_b48 = local_8e8 - local_a98;
              fStack_b44 = fStack_8e4 - local_a98;
              fStack_b40 = fStack_8e0 - local_a98;
              fStack_b3c = fStack_8dc - local_a98;
              local_aa8 = (float)local_c48 - local_ab8;
              fStack_aa4 = local_c48._4_4_ - local_ab8;
              fStack_aa0 = fStack_c40 - local_ab8;
              fStack_a9c = fStack_c3c - local_ab8;
              uVar53 = local_cd8;
              This = local_bb0;
            }
          }
          fVar113 = (auVar128._0_4_ * local_898 + (float)local_c08 * local_888) - fStack_aac;
          fVar115 = ((float)local_8a8 * fStack_894 + (float)local_c28._0_4_ * fStack_884) -
                    fStack_aac;
          fVar116 = ((float)local_8b8 * fStack_890 + (float)local_b78 * fStack_880) - fStack_aac;
          fVar117 = ((float)local_b88 * fStack_88c + (float)local_c18 * fStack_87c) - fStack_aac;
          fVar118 = (auVar128._4_4_ * local_898 + local_c08._4_4_ * local_888) - fStack_a8c;
          fVar124 = (local_8a8._4_4_ * fStack_894 + (float)local_c28._4_4_ * fStack_884) -
                    fStack_a8c;
          fVar126 = (local_8b8._4_4_ * fStack_890 + local_b78._4_4_ * fStack_880) - fStack_a8c;
          fVar127 = (local_b88._4_4_ * fStack_88c + local_c18._4_4_ * fStack_87c) - fStack_a8c;
          local_c58 = (auVar128._8_4_ * local_898 + (float)uStack_c00 * local_888) - fStack_a7c;
          fStack_c54 = ((float)uStack_8a0 * fStack_894 + fStack_c20 * fStack_884) - fStack_a7c;
          fStack_c50 = ((float)uStack_8b0 * fStack_890 + (float)uStack_b70 * fStack_880) -
                       fStack_a7c;
          fStack_c4c = ((float)uStack_b80 * fStack_88c + (float)uStack_c10 * fStack_87c) -
                       fStack_a7c;
          fVar141 = local_af8 - fVar118;
          fVar146 = fStack_af4 - fVar124;
          fStack_c40 = fStack_af0 - fVar126;
          fStack_c3c = fStack_aec - fVar127;
          local_ca8 = local_b18 - local_c58;
          fStack_ca4 = fStack_b14 - fStack_c54;
          fStack_ca0 = fStack_b10 - fStack_c50;
          fStack_c9c = fStack_b0c - fStack_c4c;
          fVar75 = local_b48 - local_af8;
          fVar99 = fStack_b44 - fStack_af4;
          fStack_cf0 = fStack_b40 - fStack_af0;
          fStack_cec = fStack_b3c - fStack_aec;
          fVar76 = local_b58 - local_b18;
          fVar102 = fStack_b54 - fStack_b14;
          fStack_cd0 = fStack_b50 - fStack_b10;
          fStack_ccc = fStack_b4c - fStack_b0c;
          local_cd8 = CONCAT44(fVar102,fVar76);
          fVar149 = local_b08 - fVar113;
          fVar152 = fStack_b04 - fVar115;
          fVar110 = fStack_b00 - fVar116;
          fVar112 = fStack_afc - fVar117;
          fVar77 = local_aa8 - local_b08;
          fVar103 = fStack_aa4 - fStack_b04;
          fStack_cc0 = fStack_aa0 - fStack_b00;
          fStack_cbc = fStack_a9c - fStack_afc;
          local_cc8 = CONCAT44(fVar103,fVar77);
          local_c48 = CONCAT44(fVar146,fVar141);
          fVar119 = (fVar141 * (local_b18 + local_c58) - local_ca8 * (local_af8 + fVar118)) *
                    fStack_b5c +
                    (local_ca8 * (local_b08 + fVar113) - (local_b18 + local_c58) * fVar149) *
                    fStack_b8c +
                    ((local_af8 + fVar118) * fVar149 - (local_b08 + fVar113) * fVar141) * fStack_c70
          ;
          fVar125 = (fVar146 * (fStack_b14 + fStack_c54) - fStack_ca4 * (fStack_af4 + fVar124)) *
                    fStack_b5c +
                    (fStack_ca4 * (fStack_b04 + fVar115) - (fStack_b14 + fStack_c54) * fVar152) *
                    fStack_b8c +
                    ((fStack_af4 + fVar124) * fVar152 - (fStack_b04 + fVar115) * fVar146) *
                    fStack_c70;
          local_a78._0_8_ = CONCAT44(fVar125,fVar119);
          local_a78._8_4_ =
               (fStack_c40 * (fStack_b10 + fStack_c50) - fStack_ca0 * (fStack_af0 + fVar126)) *
               fStack_b5c +
               (fStack_ca0 * (fStack_b00 + fVar116) - (fStack_b10 + fStack_c50) * fVar110) *
               fStack_b8c +
               ((fStack_af0 + fVar126) * fVar110 - (fStack_b00 + fVar116) * fStack_c40) * fStack_c70
          ;
          local_a78._12_4_ =
               (fStack_c3c * (fStack_b0c + fStack_c4c) - fStack_c9c * (fStack_aec + fVar127)) *
               fStack_b5c +
               (fStack_c9c * (fStack_afc + fVar117) - (fStack_b0c + fStack_c4c) * fVar112) *
               fStack_b8c +
               ((fStack_aec + fVar127) * fVar112 - (fStack_afc + fVar117) * fStack_c3c) * fStack_c70
          ;
          fVar109 = fVar118 - local_b48;
          fVar111 = fVar124 - fStack_b44;
          fVar139 = fVar126 - fStack_b40;
          fVar140 = fVar127 - fStack_b3c;
          fVar134 = local_c58 - local_b58;
          fVar136 = fStack_c54 - fStack_b54;
          fVar137 = fStack_c50 - fStack_b50;
          fVar138 = fStack_c4c - fStack_b4c;
          local_c08 = CONCAT44(fVar124,fVar118);
          uStack_c00 = CONCAT44(fVar127,fVar126);
          fVar144 = fVar113 - local_aa8;
          fVar145 = fVar115 - fStack_aa4;
          fVar147 = fVar116 - fStack_aa0;
          fVar148 = fVar117 - fStack_a9c;
          local_c18 = CONCAT44(fVar115,fVar113);
          uStack_c10 = CONCAT44(fVar117,fVar116);
          local_c28._0_4_ =
               (fVar109 * (local_b58 + local_c58) - fVar134 * (local_b48 + fVar118)) * fStack_b5c +
               (fVar134 * (local_aa8 + fVar113) - (local_b58 + local_c58) * fVar144) * fStack_b8c +
               ((local_b48 + fVar118) * fVar144 - (local_aa8 + fVar113) * fVar109) * fStack_c70;
          local_c28._4_4_ =
               (fVar111 * (fStack_b54 + fStack_c54) - fVar136 * (fStack_b44 + fVar124)) * fStack_b5c
               + (fVar136 * (fStack_aa4 + fVar115) - (fStack_b54 + fStack_c54) * fVar145) *
                 fStack_b8c +
                 ((fStack_b44 + fVar124) * fVar145 - (fStack_aa4 + fVar115) * fVar111) * fStack_c70;
          fStack_c20 = (fVar139 * (fStack_b50 + fStack_c50) - fVar137 * (fStack_b40 + fVar126)) *
                       fStack_b5c +
                       (fVar137 * (fStack_aa0 + fVar116) - (fStack_b50 + fStack_c50) * fVar147) *
                       fStack_b8c +
                       ((fStack_b40 + fVar126) * fVar147 - (fStack_aa0 + fVar116) * fVar139) *
                       fStack_c70;
          register0x000015cc =
               (fVar140 * (fStack_b4c + fStack_c4c) - fVar138 * (fStack_b3c + fVar127)) * fStack_b5c
               + (fVar138 * (fStack_a9c + fVar117) - (fStack_b4c + fStack_c4c) * fVar148) *
                 fStack_b8c +
                 ((fStack_b3c + fVar127) * fVar148 - (fStack_a9c + fVar117) * fVar140) * fStack_c70;
          local_c78 = (byte *)CONCAT44(fStack_c70,fStack_c70);
          fStack_c6c = fStack_c70;
          fVar78 = (fVar75 * local_ad8 - fVar76 * local_ac8) * fStack_b5c +
                   (fVar76 * local_ae8 - local_ad8 * fVar77) * fStack_b8c +
                   (local_ac8 * fVar77 - local_ae8 * fVar75) * fStack_c70;
          fVar105 = (fVar99 * fStack_ad4 - fVar102 * fStack_ac4) * fStack_b5c +
                    (fVar102 * fStack_ae4 - fStack_ad4 * fVar103) * fStack_b8c +
                    (fStack_ac4 * fVar103 - fStack_ae4 * fVar99) * fStack_c70;
          fVar106 = (fStack_cf0 * fStack_ad0 - fStack_cd0 * fStack_ac0) * fStack_b5c +
                    (fStack_cd0 * fStack_ae0 - fStack_ad0 * fStack_cc0) * fStack_b8c +
                    (fStack_ac0 * fStack_cc0 - fStack_ae0 * fStack_cf0) * fStack_c70;
          fVar108 = (fStack_cec * fStack_acc - fStack_ccc * fStack_abc) * fStack_b5c +
                    (fStack_ccc * fStack_adc - fStack_acc * fStack_cbc) * fStack_b8c +
                    (fStack_abc * fStack_cbc - fStack_adc * fStack_cec) * fStack_c70;
          local_c68._0_4_ = fVar119 + (float)local_c28._0_4_ + fVar78;
          local_c68._4_4_ = fVar125 + (float)local_c28._4_4_ + fVar105;
          fStack_c60 = local_a78._8_4_ + fStack_c20 + fVar106;
          fStack_c5c = local_a78._12_4_ + register0x000015cc + fVar108;
          auVar84._8_4_ = local_a78._8_4_;
          auVar84._0_8_ = local_a78._0_8_;
          auVar84._12_4_ = local_a78._12_4_;
          auVar121 = minps(auVar84,_local_c28);
          auVar43._4_4_ = fVar105;
          auVar43._0_4_ = fVar78;
          auVar43._8_4_ = fVar106;
          auVar43._12_4_ = fVar108;
          auVar121 = minps(auVar121,auVar43);
          auVar132._8_4_ = local_a78._8_4_;
          auVar132._0_8_ = local_a78._0_8_;
          auVar132._12_4_ = local_a78._12_4_;
          auVar120 = maxps(auVar132,_local_c28);
          auVar44._4_4_ = fVar105;
          auVar44._0_4_ = fVar78;
          auVar44._8_4_ = fVar106;
          auVar44._12_4_ = fVar108;
          auVar120 = maxps(auVar120,auVar44);
          fVar78 = ABS((float)local_c68._0_4_) * 1.1920929e-07;
          fVar105 = ABS((float)local_c68._4_4_) * 1.1920929e-07;
          fVar106 = ABS(fStack_c60) * 1.1920929e-07;
          fVar108 = ABS(fStack_c5c) * 1.1920929e-07;
          auVar133._4_4_ = -(uint)(auVar120._4_4_ <= fVar105);
          auVar133._0_4_ = -(uint)(auVar120._0_4_ <= fVar78);
          auVar133._8_4_ = -(uint)(auVar120._8_4_ <= fVar106);
          auVar133._12_4_ = -(uint)(auVar120._12_4_ <= fVar108);
          auVar85._4_4_ = -(uint)(-fVar105 <= auVar121._4_4_);
          auVar85._0_4_ = -(uint)(-fVar78 <= auVar121._0_4_);
          auVar85._8_4_ = -(uint)(-fVar106 <= auVar121._8_4_);
          auVar85._12_4_ = -(uint)(-fVar108 <= auVar121._12_4_);
          auVar133 = auVar133 | auVar85;
          iVar62 = movmskps((int)uVar53,auVar133);
          if (iVar62 != 0) {
            auVar143._0_4_ = fVar141 * fVar134 - local_ca8 * fVar109;
            auVar143._4_4_ = fVar146 * fVar136 - fStack_ca4 * fVar111;
            auVar143._8_4_ = fStack_c40 * fVar137 - fStack_ca0 * fVar139;
            auVar143._12_4_ = fStack_c3c * fVar138 - fStack_c9c * fVar140;
            auVar98._0_4_ = fVar109 * fVar76 - fVar134 * fVar75;
            auVar98._4_4_ = fVar111 * fVar102 - fVar136 * fVar99;
            auVar98._8_4_ = fVar139 * fStack_cd0 - fVar137 * fStack_cf0;
            auVar98._12_4_ = fVar140 * fStack_ccc - fVar138 * fStack_cec;
            auVar45._4_4_ = -(uint)(ABS(fStack_ca4 * fVar111) < ABS(fVar136 * fVar99));
            auVar45._0_4_ = -(uint)(ABS(local_ca8 * fVar109) < ABS(fVar134 * fVar75));
            auVar45._8_4_ = -(uint)(ABS(fStack_ca0 * fVar139) < ABS(fVar137 * fStack_cf0));
            auVar45._12_4_ = -(uint)(ABS(fStack_c9c * fVar140) < ABS(fVar138 * fStack_cec));
            local_a48 = blendvps(auVar98,auVar143,auVar45);
            auVar135._0_4_ = fVar134 * fVar77 - fVar144 * fVar76;
            auVar135._4_4_ = fVar136 * fVar103 - fVar145 * fVar102;
            auVar135._8_4_ = fVar137 * fStack_cc0 - fVar147 * fStack_cd0;
            auVar135._12_4_ = fVar138 * fStack_cbc - fVar148 * fStack_ccc;
            auVar46._4_4_ = -(uint)(ABS(fVar152 * fVar136) < ABS(fVar145 * fVar102));
            auVar46._0_4_ = -(uint)(ABS(fVar149 * fVar134) < ABS(fVar144 * fVar76));
            auVar46._8_4_ = -(uint)(ABS(fVar110 * fVar137) < ABS(fVar147 * fStack_cd0));
            auVar46._12_4_ = -(uint)(ABS(fVar112 * fVar138) < ABS(fVar148 * fStack_ccc));
            auVar50._4_4_ = fStack_ca4 * fVar145 - fVar152 * fVar136;
            auVar50._0_4_ = local_ca8 * fVar144 - fVar149 * fVar134;
            auVar50._8_4_ = fStack_ca0 * fVar147 - fVar110 * fVar137;
            auVar50._12_4_ = fStack_c9c * fVar148 - fVar112 * fVar138;
            local_a38 = blendvps(auVar135,auVar50,auVar46);
            auVar104._0_4_ = fVar144 * fVar75 - fVar109 * fVar77;
            auVar104._4_4_ = fVar145 * fVar99 - fVar111 * fVar103;
            auVar104._8_4_ = fVar147 * fStack_cf0 - fVar139 * fStack_cc0;
            auVar104._12_4_ = fVar148 * fStack_cec - fVar140 * fStack_cbc;
            iVar73 = -(uint)(ABS(fStack_c40 * fVar147) < ABS(fVar139 * fStack_cc0));
            iVar74 = -(uint)(ABS(fStack_c3c * fVar148) < ABS(fVar140 * fStack_cbc));
            auVar86._0_8_ =
                 CONCAT44(-(uint)(ABS(fVar146 * fVar145) < ABS(fVar111 * fVar103)),
                          -(uint)(ABS(fVar141 * fVar144) < ABS(fVar109 * fVar77)));
            auVar86._8_4_ = iVar73;
            auVar86._12_4_ = iVar74;
            auVar47._8_4_ = iVar73;
            auVar47._0_8_ = auVar86._0_8_;
            auVar47._12_4_ = iVar74;
            auVar49._4_4_ = fVar152 * fVar111 - fVar146 * fVar145;
            auVar49._0_4_ = fVar149 * fVar109 - fVar141 * fVar144;
            auVar49._8_4_ = fVar110 * fVar139 - fStack_c40 * fVar147;
            auVar49._12_4_ = fVar112 * fVar140 - fStack_c3c * fVar148;
            local_a28 = blendvps(auVar104,auVar49,auVar47);
            fVar106 = fStack_b5c * local_a48._0_4_ +
                      fStack_b8c * local_a38._0_4_ + fStack_c70 * local_a28._0_4_;
            fVar108 = fStack_b5c * local_a48._4_4_ +
                      fStack_b8c * local_a38._4_4_ + fStack_c70 * local_a28._4_4_;
            fVar109 = fStack_b5c * local_a48._8_4_ +
                      fStack_b8c * local_a38._8_4_ + fStack_c70 * local_a28._8_4_;
            fVar111 = fStack_b5c * local_a48._12_4_ +
                      fStack_b8c * local_a38._12_4_ + fStack_c70 * local_a28._12_4_;
            fVar106 = fVar106 + fVar106;
            fVar108 = fVar108 + fVar108;
            fVar109 = fVar109 + fVar109;
            fVar111 = fVar111 + fVar111;
            fVar99 = fVar113 * local_a48._0_4_ +
                     fVar118 * local_a38._0_4_ + local_c58 * local_a28._0_4_;
            fVar102 = fVar115 * local_a48._4_4_ +
                      fVar124 * local_a38._4_4_ + fStack_c54 * local_a28._4_4_;
            fVar103 = fVar116 * local_a48._8_4_ +
                      fVar126 * local_a38._8_4_ + fStack_c50 * local_a28._8_4_;
            fVar105 = fVar117 * local_a48._12_4_ +
                      fVar127 * local_a38._12_4_ + fStack_c4c * local_a28._12_4_;
            auVar51._4_4_ = fVar108;
            auVar51._0_4_ = fVar106;
            auVar51._8_4_ = fVar109;
            auVar51._12_4_ = fVar111;
            auVar121 = rcpps(auVar86,auVar51);
            fVar75 = auVar121._0_4_;
            fVar76 = auVar121._4_4_;
            fVar77 = auVar121._8_4_;
            fVar78 = auVar121._12_4_;
            local_9e8[0] = ((1.0 - fVar106 * fVar75) * fVar75 + fVar75) * (fVar99 + fVar99);
            local_9e8[1] = ((1.0 - fVar108 * fVar76) * fVar76 + fVar76) * (fVar102 + fVar102);
            local_9e8[2] = ((1.0 - fVar109 * fVar77) * fVar77 + fVar77) * (fVar103 + fVar103);
            local_9e8[3] = ((1.0 - fVar111 * fVar78) * fVar78 + fVar78) * (fVar105 + fVar105);
            fVar75 = *(float *)&(This->intersector1).intersect;
            fVar76 = *(float *)((long)&This->leafIntersector + 4);
            auVar91._0_4_ = -(uint)(local_9e8[0] <= fVar75 && fVar76 <= local_9e8[0]);
            auVar91._4_4_ = -(uint)(local_9e8[1] <= fVar75 && fVar76 <= local_9e8[1]);
            auVar91._8_4_ = -(uint)(local_9e8[2] <= fVar75 && fVar76 <= local_9e8[2]);
            auVar91._12_4_ = -(uint)(local_9e8[3] <= fVar75 && fVar76 <= local_9e8[3]);
            local_a18 = -(uint)(fVar106 != 0.0) & auVar133._0_4_ & auVar91._0_4_;
            uStack_a14 = -(uint)(fVar108 != 0.0) & auVar133._4_4_ & auVar91._4_4_;
            uStack_a10 = -(uint)(fVar109 != 0.0) & auVar133._8_4_ & auVar91._8_4_;
            uStack_a0c = -(uint)(fVar111 != 0.0) & auVar133._12_4_ & auVar91._12_4_;
            auVar52._4_4_ = uStack_a14;
            auVar52._0_4_ = local_a18;
            auVar52._8_4_ = uStack_a10;
            auVar52._12_4_ = uStack_a0c;
            uVar56 = movmskps(iVar62,auVar52);
            if (uVar56 != 0) {
              _local_a68 = _local_c28;
              local_a58 = _local_c68;
              local_9a8._8_8_ = uStack_870;
              local_9a8._0_8_ = local_878;
              auVar121 = rcpps(auVar91,_local_c68);
              fVar76 = auVar121._0_4_;
              fVar77 = auVar121._4_4_;
              fVar78 = auVar121._8_4_;
              fVar99 = auVar121._12_4_;
              fVar102 = (float)DAT_01f7ba10;
              fVar103 = DAT_01f7ba10._4_4_;
              fVar105 = DAT_01f7ba10._12_4_;
              fVar75 = DAT_01f7ba10._8_4_;
              fVar76 = (float)(-(uint)(1e-18 <= ABS((float)local_c68._0_4_)) &
                              (uint)((fVar102 - (float)local_c68._0_4_ * fVar76) * fVar76 + fVar76))
              ;
              fVar77 = (float)(-(uint)(1e-18 <= ABS((float)local_c68._4_4_)) &
                              (uint)((fVar103 - (float)local_c68._4_4_ * fVar77) * fVar77 + fVar77))
              ;
              fVar78 = (float)(-(uint)(1e-18 <= ABS(fStack_c60)) &
                              (uint)((fVar75 - fStack_c60 * fVar78) * fVar78 + fVar78));
              fVar99 = (float)(-(uint)(1e-18 <= ABS(fStack_c5c)) &
                              (uint)((fVar105 - fStack_c5c * fVar99) * fVar99 + fVar99));
              auVar123._0_4_ = fVar119 * fVar76;
              auVar123._4_4_ = fVar125 * fVar77;
              auVar123._8_4_ = local_a78._8_4_ * fVar78;
              auVar123._12_4_ = local_a78._12_4_ * fVar99;
              auVar121 = minps(auVar123,_DAT_01f7ba10);
              auVar151._0_4_ = fVar76 * (float)local_c28._0_4_;
              auVar151._4_4_ = fVar77 * (float)local_c28._4_4_;
              auVar151._8_4_ = fVar78 * fStack_c20;
              auVar151._12_4_ = fVar99 * register0x000015cc;
              auVar120 = minps(auVar151,_DAT_01f7ba10);
              auVar87._0_4_ = fVar102 - auVar121._0_4_;
              auVar87._4_4_ = fVar103 - auVar121._4_4_;
              auVar87._8_4_ = fVar75 - auVar121._8_4_;
              auVar87._12_4_ = fVar105 - auVar121._12_4_;
              auVar92._0_4_ = fVar102 - auVar120._0_4_;
              auVar92._4_4_ = fVar103 - auVar120._4_4_;
              auVar92._8_4_ = fVar75 - auVar120._8_4_;
              auVar92._12_4_ = fVar105 - auVar120._12_4_;
              local_a08 = blendvps(auVar121,auVar87,local_9a8);
              local_9f8 = blendvps(auVar120,auVar92,local_9a8);
              local_9d8 = local_a48;
              local_9c8 = local_a38;
              local_9b8 = local_a28;
              local_cd8 = (ulong)(uVar56 & 0xff);
              local_b98 = fStack_b8c;
              fStack_b94 = fStack_b8c;
              fStack_b90 = fStack_b8c;
              local_b68 = fStack_b5c;
              fStack_b64 = fStack_b5c;
              fStack_b60 = fStack_b5c;
              local_ab8 = fStack_aac;
              fStack_ab4 = fStack_aac;
              fStack_ab0 = fStack_aac;
              local_a98 = fStack_a8c;
              fStack_a94 = fStack_a8c;
              fStack_a90 = fStack_a8c;
              local_a88 = fStack_a7c;
              fStack_a84 = fStack_a7c;
              fStack_a80 = fStack_a7c;
              do {
                local_cc8 = 0;
                if (local_cd8 != 0) {
                  for (; (local_cd8 >> local_cc8 & 1) == 0; local_cc8 = local_cc8 + 1) {
                  }
                }
                local_be0 = *(uint *)(lVar67 + 0x40 + local_cc8 * 4);
                local_c48 = *(long *)(*(long *)(lVar65 + 0x1e8) + (ulong)local_be0 * 8);
                if ((*(uint *)(local_c48 + 0x34) &
                    *(uint *)((long)&(This->intersector1).intersect + 4)) == 0) {
                  local_cd8 = local_cd8 ^ 1L << (local_cc8 & 0x3f);
                }
                else {
                  pbVar64 = *(byte **)&(ray->dir).field_0;
                  if ((*(long *)(pbVar64 + 0x10) == 0) && (*(long *)(local_c48 + 0x48) == 0)) {
LAB_00225841:
                    *(undefined4 *)&(This->intersector1).intersect = 0xff800000;
                    return;
                  }
                  local_bb8 = *(undefined4 **)((long)&(ray->org).field_0 + 8);
                  local_bf8 = *(undefined4 *)(local_9d8 + local_cc8 * 4);
                  local_bf4 = *(undefined4 *)(local_9c8 + local_cc8 * 4);
                  local_bf0 = *(undefined4 *)(local_9b8 + local_cc8 * 4);
                  local_bec = *(undefined4 *)(local_a08 + local_cc8 * 4);
                  local_be8 = local_9e8[local_cc8 - 4];
                  local_be4 = *(undefined4 *)(lVar67 + 0x50 + local_cc8 * 4);
                  local_bdc = *local_bb8;
                  local_bd8 = local_bb8[1];
                  local_ca8 = (float)*(undefined4 *)&(This->intersector1).intersect;
                  *(float *)&(This->intersector1).intersect = local_9e8[local_cc8];
                  local_cdc = -1;
                  local_bc8 = &local_cdc;
                  local_bc0 = *(undefined8 *)(local_c48 + 0x18);
                  local_ba8 = &local_bf8;
                  local_ba0 = 1;
                  local_bb0 = This;
                  if (((*(code **)(local_c48 + 0x48) == (code *)0x0) ||
                      ((**(code **)(local_c48 + 0x48))(&local_bc8), *local_bc8 != 0)) &&
                     ((This = local_cb0, *(code **)(pbVar64 + 0x10) == (code *)0x0 ||
                      ((((*pbVar64 & 2) == 0 && ((*(byte *)(local_c48 + 0x3e) & 0x40) == 0)) ||
                       ((**(code **)(pbVar64 + 0x10))(&local_bc8), This = local_cb0, *local_bc8 != 0
                       )))))) goto LAB_00225841;
                  *(float *)&(local_cb0->intersector1).intersect = local_ca8;
                  local_cd8 = local_cd8 ^ 1L << (local_cc8 & 0x3f);
                  ray = local_c90;
                  This = local_cb0;
                  lVar65 = local_c80;
                  lVar67 = local_c88;
                }
              } while (local_cd8 != 0);
            }
          }
          context = (RayQueryContext *)((long)&local_b20->scene + 1);
        } while (context != local_b38);
      }
LAB_00225831:
    } while (local_b28 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }